

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

GraphicsPipelineData * __thiscall
Diligent::FixedLinearAllocator::
Construct<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
          (FixedLinearAllocator *this)

{
  GraphicsPipelineData *this_00;
  TEXTURE_FORMAT *local_20;
  GraphicsPipelineData *Ptr;
  FixedLinearAllocator *this_local;
  
  this_00 = Allocate<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
                      (this,1);
  BlendStateDesc::BlendStateDesc((BlendStateDesc *)this_00);
  (this_00->Desc).SampleMask = 0xffffffff;
  RasterizerStateDesc::RasterizerStateDesc(&(this_00->Desc).RasterizerDesc);
  DepthStencilStateDesc::DepthStencilStateDesc(&(this_00->Desc).DepthStencilDesc);
  InputLayoutDesc::InputLayoutDesc(&(this_00->Desc).InputLayout);
  (this_00->Desc).PrimitiveTopology = PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  (this_00->Desc).NumViewports = '\x01';
  (this_00->Desc).NumRenderTargets = '\0';
  (this_00->Desc).SubpassIndex = '\0';
  (this_00->Desc).ShadingRateFlags = PIPELINE_SHADING_RATE_FLAG_NONE;
  local_20 = (this_00->Desc).RTVFormats;
  do {
    *local_20 = TEX_FORMAT_UNKNOWN;
    local_20 = local_20 + 1;
  } while (local_20 != &(this_00->Desc).DSVFormat);
  (this_00->Desc).DSVFormat = TEX_FORMAT_UNKNOWN;
  (this_00->Desc).ReadOnlyDSV = false;
  SampleDesc::SampleDesc(&(this_00->Desc).SmplDesc);
  (this_00->Desc).pRenderPass = (IRenderPass *)0x0;
  (this_00->Desc).NodeMask = 0;
  RefCntAutoPtr<Diligent::IRenderPass>::RefCntAutoPtr(&this_00->pRenderPass);
  this_00->pStrides = (Uint32 *)0x0;
  this_00->BufferSlotsUsed = '\0';
  this_00->dvpRenderTargetFormatsHash = 0;
  return this_00;
}

Assistant:

NODISCARD T* Construct(Args&&... args)
    {
        T* Ptr = Allocate<T>();
        new (Ptr) T{std::forward<Args>(args)...};
        return Ptr;
    }